

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O2

void __thiscall
duckdb::CSVSniffer::AnalyzeDialectCandidate
          (CSVSniffer *this,
          unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
          *scanner,idx_t *rows_read,idx_t *best_consistent_rows,idx_t *prev_padding_count,
          idx_t *min_ignored_rows)

{
  SetColumns *this_00;
  idx_t *piVar1;
  bool null_padding;
  idx_t iVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pLVar5;
  pointer pLVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  pointer pCVar12;
  undefined4 extraout_var;
  CSVErrorHandler *pCVar13;
  reference pvVar14;
  CSVReaderOptions *pCVar15;
  pointer puVar16;
  reference pvVar17;
  CSVStateMachine *pCVar18;
  ulong uVar19;
  ulong uVar20;
  pointer puVar21;
  vector<duckdb::LogicalType,_true> *pvVar22;
  byte bVar23;
  ulong uVar24;
  vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
  *this_02;
  ulong uVar25;
  unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
  *candidate;
  vector<duckdb::ColumnCount,_true> *this_03;
  bool bVar26;
  long lStack_170;
  idx_t local_158;
  vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
  *__range4;
  ulong local_118;
  ulong local_108;
  size_type local_100;
  long local_e8;
  ulong local_e0;
  long local_d8;
  CSVError local_c0;
  ColumnCountResult *this_01;
  
  pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
            ::operator->(scanner);
  iVar11 = (*(pCVar12->super_BaseScanner)._vptr_BaseScanner[2])(pCVar12);
  this_01 = (ColumnCountResult *)CONCAT44(extraout_var,iVar11);
  if (this_01->error == true) {
    pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
              ::operator->(scanner);
    pCVar13 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                        (&(pCVar12->super_BaseScanner).error_handler);
    bVar7 = CSVErrorHandler::HasError(pCVar13,MAXIMUM_LINE_SIZE);
    if (bVar7) {
      pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                ::operator->(scanner);
      pCVar13 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                          (&(pCVar12->super_BaseScanner).error_handler);
      CSVErrorHandler::GetFirstError(&local_c0,pCVar13,MAXIMUM_LINE_SIZE);
      CSVError::operator=(&this->line_error,&local_c0);
      CSVError::~CSVError(&local_c0);
      return;
    }
    this->all_fail_max_line_size = false;
    return;
  }
  this->all_fail_max_line_size = false;
  if (this_01->result_position == 0) {
    local_158 = 1;
  }
  else {
    pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(&this_01->column_counts,0);
    local_158 = pvVar14->number_of_columns;
  }
  pCVar15 = this->options;
  bVar7 = (pCVar15->ignore_errors).value;
  if ((bVar7 == true) && (pCVar15->null_padding == false)) {
    local_158 = ColumnCountResult::GetMostFrequentColumnCount(this_01);
    pCVar15 = this->options;
    bVar23 = 1;
  }
  else {
    bVar23 = 0;
  }
  null_padding = pCVar15->null_padding;
  if (*rows_read < this_01->result_position) {
    *rows_read = this_01->result_position;
  }
  this_00 = &this->set_columns;
  this_03 = &this_01->column_counts;
  pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,0);
  bVar8 = SetColumns::IsCandidateUnacceptable
                    (this_00,local_158,null_padding,bVar7,pvVar14->last_value_always_empty);
  if (bVar8) {
    uVar25 = this->max_columns_found_error;
    if (this->max_columns_found_error < local_158) {
      uVar25 = local_158;
    }
    this->max_columns_found_error = uVar25;
    return;
  }
  local_100 = 0;
  bVar8 = false;
  local_e0 = 0;
  local_e8 = 0;
  local_108 = 0;
  lStack_170 = 0;
  local_d8 = 0;
  local_118 = 0;
  for (uVar25 = 0; uVar20 = this_01->result_position, uVar25 < uVar20; uVar25 = uVar25 + 1) {
    pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,uVar25);
    iVar2 = pvVar14->number_of_columns;
    bVar9 = this->options->null_padding;
    pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,uVar25);
    bVar9 = SetColumns::IsCandidateUnacceptable
                      (this_00,iVar2,bVar9,bVar7,pvVar14->last_value_always_empty);
    pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,uVar25);
    if (bVar9) {
      uVar20 = this->max_columns_found_error;
      if (uVar20 < pvVar14->number_of_columns) {
        pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,uVar25);
        uVar20 = pvVar14->number_of_columns;
      }
      this->max_columns_found_error = uVar20;
      return;
    }
    if (pvVar14->is_comment == true) {
      local_e8 = local_e8 + 1;
    }
    else {
      pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,uVar25);
      if (pvVar14->last_value_always_empty == true) {
        pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,uVar25);
        iVar2 = pvVar14->number_of_columns;
        pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,local_100);
        if (iVar2 == pvVar14->number_of_columns + 1) {
          lStack_170 = lStack_170 + 1;
          goto LAB_018b04d4;
        }
      }
      pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,uVar25);
      if ((((pvVar14->number_of_columns <= local_158) ||
           (((this->options->dialect_options).skip_rows.set_by_user & local_e8 == 0) != 0)) ||
          ((pvVar22 = this_00->types, pvVar22 != (vector<duckdb::LogicalType,_true> *)0x0 &&
           (((pvVar22->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (pvVar22->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish && (this->options->null_padding != true)))))) ||
         ((bool)(bVar23 & bVar8))) {
        pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,uVar25);
        if ((bool)(~bVar23 & pvVar14->number_of_columns != local_158)) {
          pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,uVar25);
          local_108 = (local_108 + 1) - (ulong)(local_158 < pvVar14->number_of_columns);
        }
        else {
          if (!bVar8) {
            (((this_01->super_ScannerResult).state_machine)->dialect_options).rows_until_header =
                 uVar25;
            bVar8 = true;
            local_118 = uVar25;
          }
          pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,uVar25);
          local_e0 = local_e0 + (pvVar14->number_of_columns != local_158);
          lStack_170 = lStack_170 + 1;
        }
      }
      else {
        if (!bVar8) {
          (((this_01->super_ScannerResult).state_machine)->dialect_options).rows_until_header =
               uVar25;
          bVar8 = true;
        }
        pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,uVar25);
        local_158 = pvVar14->number_of_columns;
        local_d8 = uVar25 - local_e8;
        local_108 = 0;
        lStack_170 = 1;
        local_118 = uVar25;
        local_100 = uVar25;
      }
    }
LAB_018b04d4:
  }
  pCVar18 = (this_01->super_ScannerResult).state_machine;
  pCVar15 = pCVar18->options;
  if ((pCVar15->dialect_options).skip_rows.set_by_user == true) {
    piVar1 = &(pCVar18->dialect_options).rows_until_header;
    *piVar1 = *piVar1 + (pCVar15->dialect_options).skip_rows.value;
  }
  uVar24 = lStack_170 + local_108;
  uVar25 = this->max_columns_found;
  uVar3 = *best_consistent_rows;
  if (uVar25 < 2) {
    puVar16 = (this->candidates).
              super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar21 = (this->candidates).
              super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar8 = local_158 <= ((long)puVar21 - (long)puVar16 >> 3) * uVar25;
  }
  else {
    puVar16 = (this->candidates).
              super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar21 = (this->candidates).
              super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar8 = true;
  }
  uVar4 = *prev_padding_count;
  this_02 = &this->candidates;
  if (puVar16 == puVar21) {
    bVar9 = true;
  }
  else {
    pvVar17 = vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
              ::front(this_02);
    pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
              ::operator->(pvVar17);
    pCVar18 = BaseScanner::GetStateMachine(&pCVar12->super_BaseScanner);
    bVar9 = (pCVar18->dialect_options).skip_rows.value < local_118;
  }
  bVar10 = AreCommentsAcceptable
                     (this_01,local_158,
                      (this->options->dialect_options).state_machine_options.comment.set_by_user);
  pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
            ::operator->(scanner);
  if ((pCVar12->super_BaseScanner).ever_quoted == true) {
    bVar26 = (((this_01->super_ScannerResult).state_machine)->dialect_options).state_machine_options
             .quote.value != '\0';
  }
  else {
    bVar26 = false;
  }
  pvVar22 = this_00->types;
  if (pvVar22 == (vector<duckdb::LogicalType,_true> *)0x0) {
    if (local_158 != 0) {
      uVar19 = 1;
      goto LAB_018b06e9;
    }
LAB_018b074c:
    uVar19 = this->max_columns_found_error;
    if (this->max_columns_found_error < local_158) {
      uVar19 = local_158;
    }
    this->max_columns_found_error = uVar19;
  }
  else {
    uVar19 = ((long)(pvVar22->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar22->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                   ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (local_158 == uVar19) goto LAB_018b074c;
    uVar19 = uVar19 + 1;
LAB_018b06e9:
    if (local_158 == uVar19) {
      pvVar14 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,0);
      if (pvVar14->last_value_always_empty != false) goto LAB_018b074c;
      pvVar22 = this_00->types;
    }
    if (pvVar22 == (vector<duckdb::LogicalType,_true> *)0x0) goto LAB_018b074c;
    uVar19 = this->max_columns_found_error;
    if (this->max_columns_found_error < local_158) {
      uVar19 = local_158;
    }
    pLVar5 = (pvVar22->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar6 = (pvVar22->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this->max_columns_found_error = uVar19;
    if (pLVar5 != pLVar6) {
      return;
    }
  }
  uVar19 = local_d8 + local_e8 + uVar24;
  bVar23 = null_padding | local_108 == 0;
  if ((uVar19 == uVar20) ||
     ((pvVar22 = this_00->types, pvVar22 != (vector<duckdb::LogicalType,_true> *)0x0 &&
      ((pvVar22->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (pvVar22->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish && bVar7 == true)))) {
    if ((bool)(bVar8 & ((uVar24 != uVar3 || local_158 <= uVar25) &&
                        (uVar24 <= uVar3 || local_158 < uVar25) || uVar4 < local_108))) {
      if ((bVar10 & ((local_108 < uVar4 && 1 < local_158) | bVar26) & bVar23) != 0) {
LAB_018b08c7:
        if (((this->candidates).
             super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->candidates).
             super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (pvVar22 = this_00->types, pvVar22 != (vector<duckdb::LogicalType,_true> *)0x0)) {
          pLVar5 = (pvVar22->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                   ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pLVar6 = (pvVar22->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                   ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if ((pLVar5 != pLVar6) &&
             ((this->max_columns_found == ((long)pLVar6 - (long)pLVar5) / 0x18 &&
              (uVar24 <= *best_consistent_rows)))) {
            pvVar17 = vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
                      ::front(this_02);
            pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                      ::operator->(pvVar17);
            if ((pCVar12->super_BaseScanner).ever_quoted != false) {
              return;
            }
            pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                      ::operator->(scanner);
            if ((pCVar12->super_BaseScanner).ever_quoted != true) {
              return;
            }
          }
        }
        pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                  ::operator->(scanner);
        pCVar18 = BaseScanner::GetStateMachine(&pCVar12->super_BaseScanner);
        if ((this->candidates).
            super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->candidates).
            super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pvVar17 = vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
                    ::front(this_02);
          pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                    ::operator->(pvVar17);
          if ((pCVar12->super_BaseScanner).ever_quoted == true) {
            pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                      ::operator->(scanner);
            if ((pCVar12->super_BaseScanner).ever_quoted != true) {
              return;
            }
            pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                      ::operator->(scanner);
            if ((pCVar12->super_BaseScanner).ever_escaped == false) {
              pvVar17 = vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
                        ::front(this_02);
              pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                        ::operator->(pvVar17);
              if (((pCVar12->super_BaseScanner).ever_escaped == true) &&
                 ((pCVar18->dialect_options).state_machine_options.strict_mode.value != false)) {
                return;
              }
            }
            if ((*best_consistent_rows == uVar24) && (this->max_columns_found <= local_158)) {
              (pCVar18->dialect_options).num_cols = local_158;
              ::std::
              vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>>>
                          *)this_02,scanner);
              this->max_columns_found = local_158;
              return;
            }
          }
        }
        uVar25 = this->max_columns_found;
        if ((uVar25 == local_158) && (*min_ignored_rows < local_e0)) {
          return;
        }
        if ((((1 < uVar25) && (uVar25 < local_158)) && (uVar24 < *best_consistent_rows >> 1)) &&
           (this->options->null_padding != false)) {
          return;
        }
        if ((bVar26 & local_158 < uVar25) == 1) {
          pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                    ::operator->(scanner);
          if (((pCVar12->super_BaseScanner).ever_escaped == true) &&
             ((pCVar18->dialect_options).state_machine_options.strict_mode.value == true)) {
            puVar21 = (this->candidates).
                      super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar16 = (this->candidates).
                           super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar21;
                puVar16 = puVar16 + 1) {
              pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                        ::operator->(puVar16);
              if (((pCVar12->super_BaseScanner).ever_quoted == true) &&
                 (pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                            ::operator->(puVar16),
                 (pCVar12->super_BaseScanner).ever_escaped != false)) {
                return;
              }
            }
          }
          else {
            puVar16 = (this->candidates).
                      super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar21 = (this->candidates).
                      super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            while (puVar16 != puVar21) {
              pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                        ::operator->(puVar16);
              puVar16 = puVar16 + 1;
              if ((pCVar12->super_BaseScanner).ever_quoted != false) {
                return;
              }
            }
          }
        }
        *best_consistent_rows = uVar24;
        this->max_columns_found = local_158;
        *prev_padding_count = local_108;
        *min_ignored_rows = local_e0;
        pCVar15 = this->options;
        if ((pCVar15->dialect_options).skip_rows.set_by_user == true) {
          if (((local_118 != 0) && (pCVar15->null_padding == false)) &&
             ((local_e8 != 0 | (pCVar15->ignore_errors).value) != 1)) {
            return;
          }
          local_118 = (pCVar15->dialect_options).skip_rows.value;
LAB_018b0c2d:
          (pCVar18->dialect_options).skip_rows.set_by_user = false;
          (pCVar18->dialect_options).skip_rows.value = local_118;
        }
        else if (pCVar15->null_padding == false) goto LAB_018b0c2d;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
        ::clear(&this_02->
                 super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
               );
        (pCVar18->dialect_options).num_cols = local_158;
        this->lines_sniffed = this_01->result_position;
        goto LAB_018b0b43;
      }
    }
    else if ((bVar23 & bVar10) == 1) goto LAB_018b08c7;
  }
  if (((((local_158 < 2 || bVar9) || uVar24 < 2) || (uVar19 != uVar20)) ||
      ((uVar4 < local_108 || ((bVar23 != 1 || (local_158 != this->max_columns_found)))))) ||
     (!bVar10)) {
    return;
  }
  pCVar12 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
            ::operator->(scanner);
  pCVar18 = BaseScanner::GetStateMachine(&pCVar12->super_BaseScanner);
  pCVar15 = this->options;
  if ((pCVar15->dialect_options).skip_rows.set_by_user == true) {
    if (((local_118 != 0) && (pCVar15->null_padding == false)) &&
       ((pCVar15->ignore_errors).value != true)) {
      return;
    }
    local_118 = (pCVar15->dialect_options).skip_rows.value;
LAB_018b0b11:
    (pCVar18->dialect_options).skip_rows.set_by_user = false;
    (pCVar18->dialect_options).skip_rows.value = local_118;
  }
  else if (pCVar15->null_padding == false) goto LAB_018b0b11;
  (pCVar18->dialect_options).num_cols = local_158;
  this->lines_sniffed = this_01->result_position;
LAB_018b0b43:
  ::std::
  vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>>>
              *)this_02,scanner);
  return;
}

Assistant:

void CSVSniffer::AnalyzeDialectCandidate(unique_ptr<ColumnCountScanner> scanner, idx_t &rows_read,
                                         idx_t &best_consistent_rows, idx_t &prev_padding_count,
                                         idx_t &min_ignored_rows) {
	// The sniffed_column_counts variable keeps track of the number of columns found for each row
	auto &sniffed_column_counts = scanner->ParseChunk();
	idx_t dirty_notes = 0;
	idx_t dirty_notes_minus_comments = 0;
	if (sniffed_column_counts.error) {
		if (!scanner->error_handler->HasError(MAXIMUM_LINE_SIZE)) {
			all_fail_max_line_size = false;
		} else {
			line_error = scanner->error_handler->GetFirstError(MAXIMUM_LINE_SIZE);
		}
		// This candidate has an error (i.e., over maximum line size or never unquoting quoted values)
		return;
	}
	all_fail_max_line_size = false;
	idx_t consistent_rows = 0;
	idx_t num_cols = sniffed_column_counts.result_position == 0 ? 1 : sniffed_column_counts[0].number_of_columns;
	const bool ignore_errors = options.ignore_errors.GetValue();
	// If we are ignoring errors and not null_padding , we pick the most frequent number of columns as the right one
	const bool use_most_frequent_columns = ignore_errors && !options.null_padding;
	if (use_most_frequent_columns) {
		num_cols = sniffed_column_counts.GetMostFrequentColumnCount();
	}
	idx_t padding_count = 0;
	idx_t comment_rows = 0;
	idx_t ignored_rows = 0;
	const bool allow_padding = options.null_padding;
	bool first_valid = false;
	if (sniffed_column_counts.result_position > rows_read) {
		rows_read = sniffed_column_counts.result_position;
	}
	if (set_columns.IsCandidateUnacceptable(num_cols, options.null_padding, ignore_errors,
	                                        sniffed_column_counts[0].last_value_always_empty)) {
		max_columns_found_error = num_cols > max_columns_found_error ? num_cols : max_columns_found_error;
		// Not acceptable
		return;
	}
	idx_t header_idx = 0;
	for (idx_t row = 0; row < sniffed_column_counts.result_position; row++) {
		if (set_columns.IsCandidateUnacceptable(sniffed_column_counts[row].number_of_columns, options.null_padding,
		                                        ignore_errors, sniffed_column_counts[row].last_value_always_empty)) {
			max_columns_found_error = sniffed_column_counts[row].number_of_columns > max_columns_found_error
			                              ? sniffed_column_counts[row].number_of_columns
			                              : max_columns_found_error;
			// Not acceptable
			return;
		}
		if (sniffed_column_counts[row].is_comment) {
			comment_rows++;
		} else if (sniffed_column_counts[row].last_value_always_empty &&
		           sniffed_column_counts[row].number_of_columns ==
		               sniffed_column_counts[header_idx].number_of_columns + 1) {
			// we allow for the first row to miss one column IF last_value_always_empty is true
			// This is so we can sniff files that have an extra delimiter on the data part.
			// e.g., C1|C2\n1|2|\n3|4|
			consistent_rows++;
		} else if (num_cols < sniffed_column_counts[row].number_of_columns &&
		           (!options.dialect_options.skip_rows.IsSetByUser() || comment_rows > 0) &&
		           (!set_columns.IsSet() || options.null_padding) && (!first_valid || (!use_most_frequent_columns))) {
			// all rows up to this point will need padding
			if (!first_valid) {
				first_valid = true;
				sniffed_column_counts.state_machine.dialect_options.rows_until_header = row;
			}
			padding_count = 0;
			// we use the maximum amount of num_cols that we find
			num_cols = sniffed_column_counts[row].number_of_columns;
			dirty_notes = row;
			dirty_notes_minus_comments = dirty_notes - comment_rows;
			header_idx = row;
			consistent_rows = 1;
		} else if (sniffed_column_counts[row].number_of_columns == num_cols || (use_most_frequent_columns)) {
			if (!first_valid) {
				first_valid = true;
				sniffed_column_counts.state_machine.dialect_options.rows_until_header = row;
				dirty_notes = row;
			}
			if (sniffed_column_counts[row].number_of_columns != num_cols) {
				ignored_rows++;
			}
			consistent_rows++;
		} else if (num_cols >= sniffed_column_counts[row].number_of_columns) {
			// we are missing some columns, we can parse this as long as we add padding
			padding_count++;
		}
	}

	if (sniffed_column_counts.state_machine.options.dialect_options.skip_rows.IsSetByUser()) {
		sniffed_column_counts.state_machine.dialect_options.rows_until_header +=
		    sniffed_column_counts.state_machine.options.dialect_options.skip_rows.GetValue();
	}
	// Calculate the total number of consistent rows after adding padding.
	consistent_rows += padding_count;

	// Whether there are more values (rows) available that are consistent, exceeding the current best.
	const bool more_values = consistent_rows > best_consistent_rows && num_cols >= max_columns_found;

	const bool more_columns = consistent_rows == best_consistent_rows && num_cols > max_columns_found;

	// If additional padding is required when compared to the previous padding count.
	const bool require_more_padding = padding_count > prev_padding_count;

	// If less padding is now required when compared to the previous padding count.
	const bool require_less_padding = padding_count < prev_padding_count;

	// If there was only a single column before, and the new number of columns exceeds that.
	const bool single_column_before = max_columns_found < 2 && num_cols > max_columns_found * candidates.size();

	// If the number of rows is consistent with the calculated value after accounting for skipped rows and the
	// start row.
	const bool rows_consistent =
	    consistent_rows + (dirty_notes_minus_comments - options.dialect_options.skip_rows.GetValue()) + comment_rows ==
	    sniffed_column_counts.result_position - options.dialect_options.skip_rows.GetValue();
	// If there are more than one consistent row.
	const bool more_than_one_row = consistent_rows > 1;

	// If there are more than one column.
	const bool more_than_one_column = num_cols > 1;

	// If the start position is valid.
	const bool start_good = !candidates.empty() &&
	                        dirty_notes <= candidates.front()->GetStateMachine().dialect_options.skip_rows.GetValue();

	// If padding happened but it is not allowed.
	const bool invalid_padding = !allow_padding && padding_count > 0;

	const bool comments_are_acceptable = AreCommentsAcceptable(
	    sniffed_column_counts, num_cols, options.dialect_options.state_machine_options.comment.IsSetByUser());

	const bool quoted =
	    scanner->ever_quoted &&
	    sniffed_column_counts.state_machine.dialect_options.state_machine_options.quote.GetValue() != '\0';

	// For our columns to match, we either don't have them manually set, or they match in value with the sniffed value
	const bool columns_match_set =
	    num_cols == set_columns.Size() ||
	    (num_cols == set_columns.Size() + 1 && sniffed_column_counts[0].last_value_always_empty) ||
	    !set_columns.IsSet();

	max_columns_found_error = num_cols > max_columns_found_error ? num_cols : max_columns_found_error;

	// If rows are consistent and no invalid padding happens, this is the best suitable candidate if one of the
	// following is valid:
	// - There's a single column before.
	// - There are more values and no additional padding is required.
	// - There's more than one column and less padding is required.
	if (columns_match_set && (rows_consistent || (set_columns.IsSet() && ignore_errors)) &&
	    (single_column_before || ((more_values || more_columns) && !require_more_padding) ||
	     (more_than_one_column && require_less_padding) || quoted) &&
	    !invalid_padding && comments_are_acceptable) {
		if (!candidates.empty() && set_columns.IsSet() && max_columns_found == set_columns.Size() &&
		    consistent_rows <= best_consistent_rows) {
			// We have a candidate that fits our requirements better
			if (candidates.front()->ever_quoted || !scanner->ever_quoted) {
				return;
			}
		}
		auto &sniffing_state_machine = scanner->GetStateMachine();

		if (!candidates.empty() && candidates.front()->ever_quoted) {
			// Give preference to quoted boys.
			if (!scanner->ever_quoted) {
				return;
			} else {
				// Give preference to one that got escaped
				if (!scanner->ever_escaped && candidates.front()->ever_escaped &&
				    sniffing_state_machine.dialect_options.state_machine_options.strict_mode.GetValue()) {
					return;
				}
				if (best_consistent_rows == consistent_rows && num_cols >= max_columns_found) {
					// If both have not been escaped, this might get solved later on.
					sniffing_state_machine.dialect_options.num_cols = num_cols;
					candidates.emplace_back(std::move(scanner));
					max_columns_found = num_cols;
					return;
				}
			}
		}
		if (max_columns_found == num_cols && (ignored_rows > min_ignored_rows)) {
			return;
		}
		if (max_columns_found > 1 && num_cols > max_columns_found && consistent_rows < best_consistent_rows / 2 &&
		    options.null_padding) {
			// When null_padding is true, we only give preference to a max number of columns if null padding is at least
			// 50% as consistent as the best case scenario
			return;
		}
		if (quoted && num_cols < max_columns_found) {
			if (scanner->ever_escaped &&
			    sniffing_state_machine.dialect_options.state_machine_options.strict_mode.GetValue()) {
				for (auto &candidate : candidates) {
					if (candidate->ever_quoted && candidate->ever_escaped) {
						return;
					}
				}

			} else {
				for (auto &candidate : candidates) {
					if (candidate->ever_quoted) {
						return;
					}
				}
			}
		}
		best_consistent_rows = consistent_rows;
		max_columns_found = num_cols;
		prev_padding_count = padding_count;
		min_ignored_rows = ignored_rows;

		if (options.dialect_options.skip_rows.IsSetByUser()) {
			// If skip rows is set by user, and we found dirty notes, we only accept it if either null_padding or
			// ignore_errors is set we have comments
			if (dirty_notes != 0 && !options.null_padding && !options.ignore_errors.GetValue() && comment_rows == 0) {
				return;
			}
			sniffing_state_machine.dialect_options.skip_rows = options.dialect_options.skip_rows.GetValue();
		} else if (!options.null_padding) {
			sniffing_state_machine.dialect_options.skip_rows = dirty_notes;
		}
		candidates.clear();
		sniffing_state_machine.dialect_options.num_cols = num_cols;
		lines_sniffed = sniffed_column_counts.result_position;
		candidates.emplace_back(std::move(scanner));
		return;
	}
	// If there's more than one row and column, the start is good, rows are consistent,
	// no additional padding is required, and there is no invalid padding, and there is not yet a candidate
	// with the same quote, we add this state_machine as a suitable candidate.
	if (columns_match_set && more_than_one_row && more_than_one_column && start_good && rows_consistent &&
	    !require_more_padding && !invalid_padding && num_cols == max_columns_found && comments_are_acceptable) {
		auto &sniffing_state_machine = scanner->GetStateMachine();

		if (options.dialect_options.skip_rows.IsSetByUser()) {
			// If skip rows is set by user, and we found dirty notes, we only accept it if either null_padding or
			// ignore_errors is set
			if (dirty_notes != 0 && !options.null_padding && !options.ignore_errors.GetValue()) {
				return;
			}
			sniffing_state_machine.dialect_options.skip_rows = options.dialect_options.skip_rows.GetValue();
		} else if (!options.null_padding) {
			sniffing_state_machine.dialect_options.skip_rows = dirty_notes;
		}
		sniffing_state_machine.dialect_options.num_cols = num_cols;
		lines_sniffed = sniffed_column_counts.result_position;
		candidates.emplace_back(std::move(scanner));
	}
}